

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

LBDOperator * lts2::CreateLbdOperatorFromYml(string *filename)

{
  LBDOperator *pLVar1;
  byte bVar2;
  ostream *poVar3;
  Size_<int> local_110;
  Size_<int> local_108;
  Size patchSize;
  FileNode local_e8 [24];
  FileNode local_d0 [24];
  FileNode local_b8 [24];
  int local_a0;
  int local_9c;
  int pheight;
  int pwidth;
  int M;
  int lbdType;
  LBDOperator *out;
  string local_78 [32];
  FileStorage local_58 [8];
  FileStorage fs;
  string *filename_local;
  
  std::__cxx11::string::string(local_78);
  cv::FileStorage::FileStorage(local_58,(string *)filename,0,local_78);
  std::__cxx11::string::~string(local_78);
  bVar2 = cv::FileStorage::isOpened();
  if ((bVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid file: ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    filename_local = (string *)0x0;
  }
  else {
    _M = (LBDOperator *)0x0;
    pwidth = 0;
    pheight = 0x200;
    local_9c = 0x20;
    local_a0 = 0x20;
    cv::FileStorage::operator[]((char *)local_b8);
    cv::operator>>(local_b8,&pwidth);
    cv::FileStorage::operator[]((char *)local_d0);
    cv::operator>>(local_d0,&pheight);
    cv::FileStorage::operator[]((char *)local_e8);
    cv::operator>>(local_e8,&local_9c);
    cv::FileStorage::operator[]((char *)&patchSize);
    cv::operator>>((FileNode *)&patchSize,&local_a0);
    _M = CreateLbdOperator(pwidth,pheight);
    if (_M != (LBDOperator *)0x0) {
      cv::Size_<int>::Size_(&local_108,local_9c,local_a0);
      pLVar1 = _M;
      cv::Size_<int>::Size_(&local_110,&local_108);
      (*(pLVar1->super_LinearOperator)._vptr_LinearOperator[5])(pLVar1,&local_110);
    }
    filename_local = (string *)_M;
  }
  out._0_4_ = 1;
  cv::FileStorage::~FileStorage(local_58);
  return (LBDOperator *)filename_local;
}

Assistant:

lts2::LBDOperator *lts2::CreateLbdOperatorFromYml(std::string const &filename)
{
  cv::FileStorage fs(filename, cv::FileStorage::READ);

  if (!fs.isOpened())
  {
    std::cerr << "Invalid file: " << filename << std::endl;
    return NULL;
  }

  LBDOperator *out = NULL;

  int lbdType = 0;
  int M = 512;
  int pwidth = 32;
  int pheight = 32;

  fs["lbd"] >> lbdType;
  fs["measures"] >> M;
  fs["width"] >> pwidth;
  fs["height"] >> pheight;

  out = lts2::CreateLbdOperator(lbdType, M);
  if (out)
  {
    cv::Size patchSize(pwidth, pheight);
    out->initWithPatchSize(patchSize);
  }

  return out;
}